

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

void __thiscall
dg::vr::StructureAnalyzer::setValidAreasFromSinglePredecessor
          (StructureAnalyzer *this,VRLocation *location,
          vector<bool,_std::allocator<bool>_> *validAreas)

{
  bool bVar1;
  VREdge *pVVar2;
  pointer pVVar3;
  VREdge *edge;
  vector<bool,_std::allocator<bool>_> *in_stack_00000050;
  vector<bool,_std::allocator<bool>_> *in_stack_00000058;
  VRAssumeBool *in_stack_00000068;
  vector<bool,_std::allocator<bool>_> *in_stack_00000070;
  VRLocation *in_stack_00000078;
  StructureAnalyzer *in_stack_00000080;
  VRInstruction *in_stack_00000168;
  vector<bool,_std::allocator<bool>_> *in_stack_00000170;
  VRLocation *in_stack_00000178;
  StructureAnalyzer *in_stack_00000180;
  undefined8 in_stack_ffffffffffffffb8;
  VRLocation *in_stack_ffffffffffffffc0;
  
  pVVar2 = VRLocation::getPredEdge
                     (in_stack_ffffffffffffffc0,(uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  ValueRelations::getValidAreas(&pVVar2->source->relations);
  std::vector<bool,_std::allocator<bool>_>::operator=(in_stack_00000058,in_stack_00000050);
  pVVar3 = std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::operator->
                     ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1f03ca);
  bVar1 = VROp::isInstruction(pVVar3);
  if (bVar1) {
    std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
              ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1f03fa);
    setValidAreasByInstruction
              (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
  }
  pVVar3 = std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::operator->
                     ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1f041f);
  bVar1 = VROp::isAssumeBool(pVVar3);
  if (bVar1) {
    std::unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_>::get
              ((unique_ptr<dg::vr::VROp,_std::default_delete<dg::vr::VROp>_> *)0x1f044e);
    setValidAreasByAssumeBool
              (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

void StructureAnalyzer::setValidAreasFromSinglePredecessor(
        VRLocation &location, std::vector<bool> &validAreas) const {
    // copy predecessors valid areas
    VREdge *edge = location.getPredEdge(0);
    validAreas = edge->source->relations.getValidAreas();

    // and alter them according to info from edge
    if (edge->op->isInstruction())
        setValidAreasByInstruction(
                location, validAreas,
                static_cast<VRInstruction *>(edge->op.get()));

    if (edge->op->isAssumeBool())
        setValidAreasByAssumeBool(location, validAreas,
                                  static_cast<VRAssumeBool *>(edge->op.get()));
}